

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::startThreads(FastText *this)

{
  rep rVar1;
  int64_t iVar2;
  int *piVar3;
  element_type *peVar4;
  int iVar5;
  long lVar6;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  thread local_60;
  timespec local_58;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->start_).__d.__r = rVar1;
  iVar5 = 0;
  LOCK();
  (this->tokenCount_).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->loss_)._M_i = -1.0;
  UNLOCK();
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          thread) {
    do {
      local_60._M_id._M_thread = (id)0;
      local_58.tv_sec = (__time_t)operator_new(0x18);
      *(undefined ***)local_58.tv_sec = &PTR___State_00135d28;
      *(FastText **)(local_58.tv_sec + 8) = this;
      *(int *)(local_58.tv_sec + 0x10) = iVar5;
      std::thread::_M_start_thread(&local_60,&local_58,0);
      if ((long *)local_58.tv_sec != (long *)0x0) {
        (**(code **)(*(long *)local_58.tv_sec + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_48,&local_60);
      if (local_60._M_id._M_thread != 0) {
        std::terminate();
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->thread);
  }
  iVar2 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this->tokenCount_).super___atomic_base<long>._M_i < peVar4->epoch * iVar2) {
    do {
      local_58.tv_sec = 0;
      local_58.tv_nsec = 100000000;
      do {
        iVar5 = nanosleep(&local_58,&local_58);
        if (iVar5 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      if ((0.0 <= (this->loss_)._M_i) &&
         (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->verbose)) {
        lVar6 = (this->tokenCount_).super___atomic_base<long>._M_i;
        iVar5 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->epoch;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\r",1);
        printInfo(this,(float)lVar6 / (float)(iVar5 * iVar2),(this->loss_)._M_i,
                  (ostream *)&std::cerr);
      }
      peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    } while ((this->tokenCount_).super___atomic_base<long>._M_i < peVar4->epoch * iVar2);
  }
  if (0 < peVar4->thread) {
    lVar6 = 0;
    do {
      std::thread::join();
      peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar6 = lVar6 + 1;
    } while (lVar6 < peVar4->thread);
  }
  if (0 < peVar4->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\r",1);
    printInfo(this,1.0,(this->loss_)._M_i,(ostream *)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  return;
}

Assistant:

void FastText::startThreads() {
	start_ = std::chrono::steady_clock::now();
	tokenCount_ = 0;
	loss_ = -1;
	std::vector<std::thread> threads;
	for (int32_t i = 0; i < args_->thread; i++) {
		threads.push_back(std::thread([=]() { trainThread(i); }));
	}
	const int64_t ntokens = dict_->ntokens();
	// Same condition as trainThread
	while (tokenCount_ < args_->epoch * ntokens) {
		std::this_thread::sleep_for(std::chrono::milliseconds(100));
		if (loss_ >= 0 && args_->verbose > 1) {
			real progress = real(tokenCount_) / (args_->epoch * ntokens);
			std::cerr << "\r";
			printInfo(progress, loss_, std::cerr);
		}
	}
	for (int32_t i = 0; i < args_->thread; i++) {
		threads[i].join();
	}
	if (args_->verbose > 0) {
		std::cerr << "\r";
		printInfo(1.0, loss_, std::cerr);
		std::cerr << std::endl;
	}
}